

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::LongNameHandler::multiSimpleFormatsToModifiers
          (LongNameHandler *this,UnicodeString *leadFormats,UnicodeString *trailFormat,Field field,
          UErrorCode *status)

{
  long lVar1;
  SimpleModifier *this_00;
  Parameters local_1c0;
  UnicodeString leadFormat;
  UnicodeString compoundFormat;
  SimpleFormatter trailCompiled;
  SimpleFormatter compoundCompiled;
  SimpleModifier local_a0;
  
  SimpleFormatter::SimpleFormatter(&trailCompiled,trailFormat,1,1,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (SimpleModifier *)&this->field_0x10;
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      anon_unknown.dwarf_1672cb::getWithPlural(&leadFormat,leadFormats,(Form)lVar1,status);
      if (U_ZERO_ERROR < *status) {
LAB_00251d01:
        UnicodeString::~UnicodeString(&leadFormat);
        break;
      }
      compoundFormat.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_003a7268;
      compoundFormat.fUnion.fStackFields.fLengthAndFlags = 2;
      SimpleFormatter::format(&trailCompiled,&leadFormat,&compoundFormat,status);
      if (U_ZERO_ERROR < *status) {
LAB_00251cf7:
        UnicodeString::~UnicodeString(&compoundFormat);
        goto LAB_00251d01;
      }
      SimpleFormatter::SimpleFormatter(&compoundCompiled,&compoundFormat,0,1,status);
      if (U_ZERO_ERROR < *status) {
        SimpleFormatter::~SimpleFormatter(&compoundCompiled);
        goto LAB_00251cf7;
      }
      Modifier::Parameters::Parameters(&local_1c0,&this->super_ModifierStore,'\0',(Form)lVar1);
      SimpleModifier::SimpleModifier(&local_a0,&compoundCompiled,field,false,local_1c0);
      SimpleModifier::operator=(this_00,&local_a0);
      SimpleModifier::~SimpleModifier(&local_a0);
      SimpleFormatter::~SimpleFormatter(&compoundCompiled);
      UnicodeString::~UnicodeString(&compoundFormat);
      UnicodeString::~UnicodeString(&leadFormat);
      this_00 = this_00 + 1;
    }
  }
  SimpleFormatter::~SimpleFormatter(&trailCompiled);
  return;
}

Assistant:

void LongNameHandler::multiSimpleFormatsToModifiers(const UnicodeString *leadFormats, UnicodeString trailFormat,
                                                    Field field, UErrorCode &status) {
    SimpleFormatter trailCompiled(trailFormat, 1, 1, status);
    if (U_FAILURE(status)) { return; }
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        StandardPlural::Form plural = static_cast<StandardPlural::Form>(i);
        UnicodeString leadFormat = getWithPlural(leadFormats, plural, status);
        if (U_FAILURE(status)) { return; }
        UnicodeString compoundFormat;
        trailCompiled.format(leadFormat, compoundFormat, status);
        if (U_FAILURE(status)) { return; }
        SimpleFormatter compoundCompiled(compoundFormat, 0, 1, status);
        if (U_FAILURE(status)) { return; }
        fModifiers[i] = SimpleModifier(compoundCompiled, field, false, {this, 0, plural});
    }
}